

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O3

void test_read_num<int,long,int(*)(char_const**,int*)>
               (long num1,_func_int_char_ptr_ptr_int_ptr *read_f,bool is_ok)

{
  mp_type mVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  byte *pbVar9;
  byte bVar10;
  ulong uVar11;
  undefined1 *puVar12;
  code *pcVar13;
  char (*pacVar14) [16];
  char (*pacVar15) [16];
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  float fVar16;
  uint extraout_EDX_01;
  char *pcVar17;
  char *pcVar18;
  double dVar19;
  uint uVar20;
  byte *pbVar21;
  char *pcVar22;
  undefined8 *puVar23;
  byte *pbVar24;
  char *pcVar25;
  byte *pbVar26;
  uint *val;
  char (*pacVar27) [16];
  char cVar28;
  byte *pbVar29;
  char *pcVar30;
  undefined8 uVar31;
  byte *pbVar32;
  char *pcVar33;
  undefined8 *puVar34;
  undefined1 *puVar35;
  char *pcVar36;
  undefined *puVar37;
  ulong uVar38;
  undefined1 *puVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  char mp_nums [16] [16];
  char str [256];
  double dStack_12e0;
  undefined1 *puStack_12d8;
  char acStack_12d0 [256];
  undefined1 uStack_11d0;
  undefined8 uStack_11cf;
  undefined1 auStack_11c7 [255];
  char (*pacStack_10c8) [16];
  undefined8 uStack_10c0;
  undefined *puStack_10b8;
  code *pcStack_10b0;
  double dStack_10a8;
  byte *pbStack_10a0;
  char acStack_1098 [256];
  byte abStack_f98 [16];
  byte abStack_f88 [248];
  long lStack_e90;
  ulong uStack_e88;
  char *pcStack_e80;
  char *pcStack_e78;
  char *pcStack_e70;
  code *pcStack_e68;
  char (*pacStack_e60) [16];
  char *pcStack_e58;
  float fStack_e50;
  undefined4 uStack_e4c;
  double dStack_e48;
  double dStack_e40;
  char (*pacStack_e38) [16];
  char acStack_e30 [256];
  byte bStack_d30;
  undefined8 uStack_d2f;
  char acStack_d27 [255];
  long lStack_c28;
  ulong uStack_c20;
  char *pcStack_c18;
  char *pcStack_c10;
  char *pcStack_c08;
  code *pcStack_c00;
  char (*pacStack_bf8) [16];
  char *pcStack_bf0;
  float fStack_be8;
  undefined4 uStack_be4;
  double dStack_be0;
  double dStack_bd8;
  code *pcStack_bd0;
  byte bStack_bc8;
  undefined8 uStack_bc7;
  char acStack_bbf [247];
  char acStack_ac8 [256];
  undefined1 auStack_9c8 [8];
  undefined8 *puStack_9c0;
  ulong uStack_9b8;
  undefined8 *puStack_9b0;
  long lStack_9a8;
  undefined1 *puStack_9a0;
  code *pcStack_998;
  code *pcStack_990;
  float fStack_984;
  double dStack_980;
  double dStack_978;
  undefined8 *puStack_970;
  char (*pacStack_968) [16];
  byte bStack_960;
  undefined1 auStack_95f [2];
  undefined1 auStack_95d [6];
  undefined8 auStack_957 [30];
  char acStack_860 [256];
  undefined1 auStack_760 [8];
  char (*pacStack_758) [16];
  char *pcStack_750;
  char *pcStack_748;
  char (*pacStack_740) [16];
  long lStack_738;
  code *pcStack_730;
  float fStack_71c;
  char (*pacStack_718) [16];
  int iStack_70c;
  double dStack_708;
  double dStack_700;
  byte bStack_6f8;
  undefined8 uStack_6f7;
  char acStack_6ef [247];
  char acStack_5f8 [256];
  undefined1 auStack_4f8 [8];
  ulong uStack_4f0;
  char *pcStack_4e8;
  long lStack_4e0;
  undefined1 *puStack_4d8;
  undefined1 *puStack_4d0;
  code *pcStack_4c8;
  uint uStack_4b4;
  ulong uStack_4b0;
  float fStack_4a4;
  ulong uStack_4a0;
  double dStack_498;
  byte bStack_490;
  undefined8 uStack_48f;
  undefined1 auStack_487 [247];
  char acStack_390 [256];
  char acStack_290 [8];
  byte *pbStack_288;
  byte *pbStack_280;
  byte *pbStack_278;
  char *pcStack_270;
  ulong uStack_268;
  code *pcStack_260;
  ulong local_258;
  float local_250;
  undefined4 local_24c;
  ulong local_248;
  double local_240;
  byte local_238;
  undefined8 local_237;
  byte local_22f [247];
  char local_138 [256];
  undefined1 local_38 [8];
  
  local_24c = SUB84(read_f,0);
  builtin_strncpy(local_138,"typed read of ",0xf);
  pcVar17 = "%lld";
  if (-1 < num1) {
    pcVar17 = "%llu";
  }
  iVar4 = 0;
  pcStack_260 = (code *)0x13771d;
  iVar3 = snprintf(local_138 + 0xe,0xf2,pcVar17,num1);
  pbVar9 = (byte *)(local_138 + (long)iVar3 + 0xe);
  pcStack_260 = (code *)0x137741;
  iVar3 = snprintf((char *)pbVar9,(size_t)(local_38 + -(long)pbVar9)," into ");
  pcStack_260 = (code *)0x137760;
  snprintf((char *)(pbVar9 + iVar3),(size_t)(local_38 + -(long)(pbVar9 + iVar3)),"int%zu_t",0x20);
  pcStack_260 = (code *)0x13776f;
  _space((FILE *)_stdout);
  pcStack_260 = (code *)0x137788;
  fwrite("# ",2,1,_stdout);
  pcStack_260 = (code *)0x137798;
  fputs(local_138,_stdout);
  pcStack_260 = (code *)0x1377a5;
  fputc(10,_stdout);
  local_258 = num1;
  if (-1 < num1) {
    pcStack_260 = (code *)0x1377bb;
    iVar4 = test_encode_uint_all_sizes((char (*) [16])&local_238,num1);
  }
  pacVar15 = (char (*) [16])(&local_238 + (long)iVar4 * 0x10);
  pcStack_260 = (code *)0x1377d8;
  iVar3 = test_encode_int_all_sizes(pacVar15,local_258);
  uVar20 = iVar4 + iVar3;
  if (uVar20 != 0 && SCARRY4(iVar4,iVar3) == (int)uVar20 < 0) {
    local_250 = (float)(long)local_258;
    local_240 = (double)(long)local_258;
    pbVar32 = (byte *)(ulong)uVar20;
    pbVar24 = (byte *)((long)&local_237 + 1);
    uVar38 = 0;
    do {
      uVar20 = (uint)pacVar15;
      lVar6 = uVar38 * 0x10;
      pbVar21 = &local_238 + lVar6;
      pbVar29 = pbVar24 + -2;
      bVar10 = pbVar24[-2];
      uVar11 = (ulong)bVar10;
      uVar7 = (ulong)(uint)(int)(char)bVar10;
      mVar1 = mp_type_hint[uVar11];
      pbVar26 = pbVar24;
      if (mVar1 != MP_UINT) {
        if (mVar1 == MP_FLOAT) {
          if (bVar10 != 0xca) {
LAB_00137bd8:
            pcStack_260 = (code *)0x137bf7;
            __assert_fail("c == 0xca",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                          ,0x97e,"float mp_decode_float(const char **)");
          }
          uVar2 = *(uint *)(pbVar24 + -1);
          fVar16 = (float)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                          uVar2 << 0x18);
          if ((fVar16 == local_250) && (!NAN(fVar16) && !NAN(local_250))) {
            pbVar26 = pbVar24 + 3;
            goto LAB_0013790e;
          }
          pcStack_260 = (code *)0x137bfc;
          test_read_num<int,long,int(*)(char_const**,int*)>();
LAB_00137bfc:
          pcStack_260 = (code *)0x137c01;
          test_read_num<int,long,int(*)(char_const**,int*)>();
          goto LAB_00137c01;
        }
        if (mVar1 == MP_INT) {
          uVar11 = (ulong)(char)bVar10;
          switch(bVar10) {
          case 0xd0:
            uVar11 = (ulong)(char)pbVar24[-1];
            break;
          case 0xd1:
            uVar11 = (ulong)(short)(*(ushort *)(pbVar24 + -1) << 8 | *(ushort *)(pbVar24 + -1) >> 8)
            ;
            pbVar26 = local_22f + lVar6 + -6;
            break;
          case 0xd2:
            uVar2 = *(uint *)(pbVar24 + -1);
            uVar11 = (ulong)(int)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                                 uVar2 << 0x18);
            pbVar26 = local_22f + lVar6 + -4;
            break;
          case 0xd3:
            uVar11 = *(ulong *)(pbVar24 + -1);
            uVar11 = uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                     (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                     (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                     (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
            pbVar26 = local_22f + lVar6;
            break;
          default:
            if (bVar10 < 0xe0) {
              pcStack_260 = (code *)0x137baa;
              test_read_num<int,long,int(*)(char_const**,int*)>();
              goto LAB_00137baa;
            }
            pbVar26 = local_22f + lVar6 + -8;
          }
          if (uVar11 != local_258) goto LAB_00137bfc;
          goto LAB_0013799d;
        }
        if (bVar10 != 0xcb) goto LAB_00137bb4;
        uVar7 = *(ulong *)(pbVar24 + -1);
        dVar19 = (double)(uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                          (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                          (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                          (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38);
        if ((dVar19 != local_240) || (NAN(dVar19) || NAN(local_240))) {
          pcStack_260 = (code *)0x137bd8;
          test_read_num<int,long,int(*)(char_const**,int*)>();
          goto LAB_00137bd8;
        }
        pbVar26 = local_22f + lVar6;
        goto LAB_0013790e;
      }
      switch(bVar10) {
      case 0xcc:
        uVar11 = (ulong)pbVar24[-1];
        break;
      case 0xcd:
        uVar11 = (ulong)(ushort)(*(ushort *)(pbVar24 + -1) << 8 | *(ushort *)(pbVar24 + -1) >> 8);
        pbVar26 = local_22f + lVar6 + -6;
        break;
      case 0xce:
        uVar2 = *(uint *)(pbVar24 + -1);
        uVar11 = (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                        uVar2 << 0x18);
        pbVar26 = local_22f + lVar6 + -4;
        break;
      case 0xcf:
        uVar11 = *(ulong *)(pbVar24 + -1);
        uVar11 = uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                 (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                 (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                 (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
        pbVar26 = local_22f + lVar6;
        break;
      default:
        if (-1 < (char)bVar10) {
          pbVar26 = local_22f + lVar6 + -8;
          break;
        }
LAB_00137baa:
        pcStack_260 = (code *)0x137baf;
        test_read_num<int,long,int(*)(char_const**,int*)>();
        goto LAB_00137baf;
      }
      if (uVar11 != local_258) {
LAB_00137c01:
        pcStack_260 = (code *)0x137c06;
        test_read_num<int,long,int(*)(char_const**,int*)>();
        pbVar26 = pbVar32;
        pcVar17 = (char *)num1;
        goto LAB_00137c06;
      }
LAB_0013799d:
      switch(bVar10) {
      case 0xcc:
        uVar7 = (ulong)pbVar24[-1];
        goto LAB_001379ca;
      case 0xcd:
        pbVar21 = local_22f + lVar6 + -6;
        uVar7 = (ulong)(ushort)(*(ushort *)(pbVar24 + -1) << 8 | *(ushort *)(pbVar24 + -1) >> 8);
        break;
      case 0xce:
        uVar20 = *(uint *)(pbVar24 + -1);
        uVar7 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                       uVar20 << 0x18);
        pbVar21 = pbVar24 + 3;
        goto LAB_001379e6;
      case 0xcf:
        uVar7 = *(ulong *)(pbVar24 + -1);
        uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28 |
                uVar7 << 0x38;
        pbVar21 = local_22f + lVar6;
LAB_001379e6:
        if (uVar7 < 0x80000000) break;
LAB_0013790e:
        uVar7 = 0;
        iVar4 = 1;
        iVar3 = 0;
        pbVar21 = pbVar29;
        goto LAB_00137a3f;
      case 0xd0:
        uVar7 = (ulong)(uint)(int)(char)pbVar24[-1];
LAB_001379ca:
        pbVar21 = local_22f + lVar6 + -7;
        break;
      case 0xd1:
        pbVar21 = local_22f + lVar6 + -6;
        uVar7 = (ulong)(uint)(int)(short)(*(ushort *)(pbVar24 + -1) << 8 |
                                         *(ushort *)(pbVar24 + -1) >> 8);
        break;
      case 0xd2:
        uVar20 = *(uint *)(pbVar24 + -1);
        uVar7 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                       uVar20 << 0x18);
        pbVar21 = local_22f + lVar6 + -4;
        break;
      case 0xd3:
        uVar7 = *(ulong *)(pbVar24 + -1);
        uVar11 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                 (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8;
        uVar7 = uVar11 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
        if ((long)(int)uVar11 == uVar7) {
          pbVar21 = local_22f + lVar6;
          break;
        }
        goto LAB_0013790e;
      default:
        if ((char)bVar10 < -0x20) goto LAB_0013790e;
        iVar3 = 1;
        iVar4 = 0;
        pbVar21 = local_22f + lVar6 + -8;
        goto LAB_00137a3f;
      }
      iVar3 = 1;
      iVar4 = 0;
LAB_00137a3f:
      if ((char)local_24c == '\0') {
        pcStack_260 = (code *)0x137b01;
        _ok(iVar4,"rc == -1",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x737,"check failure for code 0x%02X");
        pacVar15 = (char (*) [16])(ulong)(pbVar29 == pbVar21);
        pcStack_260 = (code *)0x137b27;
        _ok((uint)(pbVar29 == pbVar21),"mp_num_pos2 == mp_nums[i]",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x738,"check position");
      }
      else {
        pcVar17 = 
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
        pcStack_260 = (code *)0x137a7e;
        local_248 = uVar38;
        _ok(iVar3,"rc == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73b,"check success for code 0x%02X");
        uVar20 = (uint)(pbVar26 == pbVar21);
        pcStack_260 = (code *)0x137aa4;
        _ok((uint)(pbVar26 == pbVar21),"mp_num_pos1 == mp_num_pos2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73c,"check position");
        iVar3 = (int)uVar7;
        if ((long)local_258 < 0) {
          pbVar9 = pbVar32;
          uVar38 = uVar7;
          if (-1 < iVar3) {
LAB_00137c06:
            pcStack_260 = test_read_num<long,int,int(*)(char_const**,long*)>;
            test_read_num<int,long,int(*)(char_const**,int*)>();
            builtin_strncpy(acStack_390,"typed read of ",0xf);
            uVar7 = (ulong)(int)uVar20;
            if ((int)uVar20 < 0) {
              pcVar18 = "%lld";
              uVar11 = uVar7;
            }
            else {
              pcVar18 = "%llu";
              uVar11 = (ulong)uVar20;
            }
            pcStack_4c8 = (code *)0x137c8b;
            uStack_4b4 = uVar20;
            pbStack_288 = pbVar21;
            pbStack_280 = pbVar9;
            pbStack_278 = pbVar26;
            pcStack_270 = pcVar17;
            uStack_268 = uVar38;
            pcStack_260 = (code *)pbVar24;
            iVar3 = snprintf(acStack_390 + 0xe,0xf2,pcVar18,uVar11);
            pcVar18 = acStack_390 + 0xe + iVar3;
            iVar4 = 0;
            pcStack_4c8 = (code *)0x137ca9;
            iVar3 = snprintf(pcVar18,(size_t)(acStack_290 + -(long)pcVar18)," into ");
            pcVar17 = acStack_290 + -(long)(pcVar18 + iVar3);
            pcStack_4c8 = (code *)0x137cc8;
            snprintf(pcVar18 + iVar3,(size_t)pcVar17,"int%zu_t",0x40);
            pcStack_4c8 = (code *)0x137cd7;
            _space((FILE *)_stdout);
            pcStack_4c8 = (code *)0x137cf0;
            fwrite("# ",2,1,_stdout);
            pcStack_4c8 = (code *)0x137d00;
            fputs(acStack_390,_stdout);
            pcStack_4c8 = (code *)0x137d0d;
            fputc(10,_stdout);
            if (-1 < (int)uStack_4b4) {
              pcStack_4c8 = (code *)0x137d21;
              iVar4 = test_encode_uint_all_sizes((char (*) [16])&bStack_490,(ulong)uVar20);
            }
            pacVar15 = (char (*) [16])(&bStack_490 + (long)iVar4 * 0x10);
            pcStack_4c8 = (code *)0x137d3d;
            iVar3 = test_encode_int_all_sizes(pacVar15,uVar7);
            uVar20 = iVar4 + iVar3;
            if (uVar20 == 0 || SCARRY4(iVar4,iVar3) != (int)uVar20 < 0) {
              return;
            }
            fStack_4a4 = (float)(int)uStack_4b4;
            dStack_498 = (double)(int)uStack_4b4;
            uStack_4a0 = (ulong)uVar20;
            puVar39 = (undefined1 *)((long)&uStack_48f + 1);
            lVar6 = 0;
            uStack_4b0 = uVar7;
            goto LAB_00137d70;
          }
          uVar7 = (ulong)iVar3;
          pcVar17 = "(int64_t)num1 == (int64_t)num2";
          iVar3 = 0x746;
        }
        else {
          if (iVar3 < 0) {
LAB_00137baf:
            pcStack_260 = (code *)0x137bb4;
            test_read_num<int,long,int(*)(char_const**,int*)>();
LAB_00137bb4:
            pcStack_260 = (code *)0x137bd3;
            __assert_fail("c == 0xcb",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                          ,0x987,"double mp_decode_double(const char **)");
          }
          uVar7 = uVar7 & 0xffffffff;
          pcVar17 = "(uint64_t)num1 == (uint64_t)num2";
          iVar3 = 0x743;
        }
        pacVar15 = (char (*) [16])(ulong)(uVar7 == local_258);
        pcStack_260 = (code *)0x137b62;
        _ok((uint)(uVar7 == local_258),pcVar17,
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            iVar3,"check int number");
        pbVar29 = pbVar32;
        uVar38 = local_248;
      }
      uVar38 = uVar38 + 1;
      pbVar24 = pbVar24 + 0x10;
      pbVar32 = pbVar32 + -1;
      pbVar9 = pbVar29;
      num1 = (long)
             "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
      ;
    } while (pbVar32 != (byte *)0x0);
  }
  return;
LAB_00137d70:
  lVar8 = lVar6 * 0x10;
  puVar12 = puVar39 + -2;
  bVar10 = puVar39[-2];
  uVar38 = (ulong)bVar10;
  uVar7 = (ulong)(char)bVar10;
  mVar1 = mp_type_hint[uVar38];
  puVar35 = puVar39;
  if (mVar1 != MP_UINT) {
    if (mVar1 == MP_FLOAT) {
      if (bVar10 != 0xca) goto LAB_0013809f;
      uVar20 = *(uint *)(puVar39 + -1);
      fVar16 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                      uVar20 << 0x18);
      if ((fVar16 != fStack_4a4) || (NAN(fVar16) || NAN(fStack_4a4))) {
        pcStack_4c8 = (code *)0x1380c3;
        test_read_num<long,int,int(*)(char_const**,long*)>();
        goto LAB_001380c3;
      }
      puVar35 = puVar39 + 3;
      goto LAB_00137e70;
    }
    if (mVar1 == MP_INT) {
      iVar3 = bVar10 - 0xd0;
      val = &switchD_00137dd0::switchdataD_00140d7c;
      switch(iVar3) {
      case 0:
        uVar38 = (ulong)(char)puVar39[-1];
        break;
      case 1:
        uVar38 = (ulong)(short)(*(ushort *)(puVar39 + -1) << 8 | *(ushort *)(puVar39 + -1) >> 8);
        puVar35 = auStack_487 + lVar8 + -6;
        break;
      case 2:
        uVar20 = *(uint *)(puVar39 + -1);
        uVar38 = (ulong)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                             uVar20 << 0x18);
        puVar35 = auStack_487 + lVar8 + -4;
        break;
      case 3:
        uVar38 = *(ulong *)(puVar39 + -1);
        uVar38 = uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                 (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                 (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                 (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38;
        puVar35 = auStack_487 + lVar8;
        break;
      default:
        if (bVar10 < 0xe0) {
          pcStack_4c8 = (code *)0x13808b;
          test_read_num<long,int,int(*)(char_const**,long*)>();
          goto LAB_0013808b;
        }
        uVar38 = uVar7;
        val = (uint *)pacVar15;
        puVar35 = auStack_487 + lVar8 + -8;
      }
      if (uVar38 != uStack_4b0) {
        pcStack_4c8 = (code *)0x1380e7;
        test_read_num<long,int,int(*)(char_const**,long*)>();
        goto LAB_001380e7;
      }
      goto LAB_00137f04;
    }
    if (bVar10 != 0xcb) {
LAB_001380c3:
      pcStack_4c8 = (code *)0x1380e2;
      __assert_fail("c == 0xcb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x987,"double mp_decode_double(const char **)");
    }
    uVar38 = *(ulong *)(puVar39 + -1);
    dVar19 = (double)(uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                      (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                      (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                      (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38);
    if ((dVar19 == dStack_498) && (!NAN(dVar19) && !NAN(dStack_498))) {
      puVar35 = auStack_487 + lVar8;
      goto LAB_00137e70;
    }
    goto LAB_0013809a;
  }
  iVar3 = bVar10 - 0xcc;
  val = &switchD_00137e2e::switchdataD_00140d6c;
  switch(iVar3) {
  case 0:
    uVar38 = (ulong)(byte)puVar39[-1];
    break;
  case 1:
    uVar38 = (ulong)(ushort)(*(ushort *)(puVar39 + -1) << 8 | *(ushort *)(puVar39 + -1) >> 8);
    puVar35 = auStack_487 + lVar8 + -6;
    break;
  case 2:
    uVar20 = *(uint *)(puVar39 + -1);
    uVar38 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                    uVar20 << 0x18);
    puVar35 = auStack_487 + lVar8 + -4;
    break;
  case 3:
    uVar38 = *(ulong *)(puVar39 + -1);
    uVar38 = uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
             (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
             (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 | (uVar38 & 0xff00) << 0x28 |
             uVar38 << 0x38;
    puVar35 = auStack_487 + lVar8;
    break;
  default:
    if (-1 < (char)bVar10) {
      val = (uint *)pacVar15;
      puVar35 = auStack_487 + lVar8 + -8;
      break;
    }
LAB_0013808b:
    pcStack_4c8 = (code *)0x138090;
    test_read_num<long,int,int(*)(char_const**,long*)>();
    goto LAB_00138090;
  }
  if (uVar38 != uStack_4b0) {
LAB_001380e7:
    pcStack_4c8 = test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>;
    test_read_num<long,int,int(*)(char_const**,long*)>();
    builtin_strncpy(acStack_5f8,"typed read of ",0xf);
    pcStack_730 = (code *)0x138151;
    pacStack_718 = (char (*) [16])val;
    iStack_70c = iVar3;
    uStack_4f0 = uVar7;
    pcStack_4e8 = pcVar17;
    lStack_4e0 = lVar6;
    puStack_4d8 = puVar35;
    puStack_4d0 = puVar39;
    pcStack_4c8 = (code *)puVar12;
    iVar3 = snprintf(acStack_5f8 + 0xe,0xf2,"%llu",val);
    pcVar17 = acStack_5f8 + (long)iVar3 + 0xe;
    pcStack_730 = (code *)0x138175;
    iVar3 = snprintf(pcVar17,(size_t)(auStack_4f8 + -(long)pcVar17)," into ");
    pcStack_730 = (code *)0x138194;
    snprintf(pcVar17 + iVar3,(size_t)(auStack_4f8 + -(long)(pcVar17 + iVar3)),"int%zu_t",0x40);
    pcStack_730 = (code *)0x1381a3;
    _space((FILE *)_stdout);
    pcStack_730 = (code *)0x1381bc;
    fwrite("# ",2,1,_stdout);
    pcStack_730 = (code *)0x1381cc;
    fputs(acStack_5f8,_stdout);
    pcStack_730 = (code *)0x1381d9;
    fputc(10,_stdout);
    pacVar15 = (char (*) [16])&bStack_6f8;
    pcStack_730 = (code *)0x1381e6;
    pcVar18 = (char *)val;
    uVar20 = test_encode_uint_all_sizes(pacVar15,(uint64_t)val);
    if (-1 < (long)val) {
      pacVar15 = (char (*) [16])(&bStack_6f8 + (long)(int)uVar20 * 0x10);
      pcVar18 = (char *)0x7fffffffffffffff;
      pcStack_730 = (code *)0x13820b;
      iVar3 = test_encode_int_all_sizes(pacVar15,0x7fffffffffffffff);
      uVar20 = uVar20 + iVar3;
    }
    if ((int)uVar20 < 1) {
      return;
    }
    fStack_71c = (float)pacStack_718;
    auVar41._8_4_ = (int)((ulong)pacStack_718 >> 0x20);
    auVar41._0_8_ = pacStack_718;
    auVar41._12_4_ = 0x45300000;
    dStack_700 = auVar41._8_8_ - 1.9342813113834067e+25;
    dStack_708 = dStack_700 + ((double)CONCAT44(0x43300000,(int)pacStack_718) - 4503599627370496.0);
    pcVar22 = (char *)(ulong)uVar20;
    pcVar33 = (char *)((long)&uStack_6f7 + 1);
    lVar6 = 0;
    goto LAB_00138274;
  }
LAB_00137f04:
  switch(bVar10) {
  case 0xcc:
    uVar7 = (ulong)(byte)puVar39[-1];
    goto LAB_00137f32;
  case 0xcd:
    puVar12 = auStack_487 + lVar8 + -6;
    uVar7 = (ulong)(ushort)(*(ushort *)(puVar39 + -1) << 8 | *(ushort *)(puVar39 + -1) >> 8);
    break;
  case 0xce:
    uVar20 = *(uint *)(puVar39 + -1);
    uVar7 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                   uVar20 << 0x18);
    puVar12 = auStack_487 + lVar8 + -4;
    break;
  case 0xcf:
    uVar38 = *(ulong *)(puVar39 + -1);
    uVar7 = uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 | (uVar38 & 0xff0000000000) >> 0x18
            | (uVar38 & 0xff00000000) >> 8 | (uVar38 & 0xff000000) << 8 |
            (uVar38 & 0xff0000) << 0x18 | (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38;
    if (-1 < (long)uVar7) goto LAB_00137f5c;
LAB_00137e70:
    uVar7 = 0;
    iVar3 = 0;
    goto LAB_00137faa;
  case 0xd0:
    uVar7 = (ulong)(char)puVar39[-1];
LAB_00137f32:
    puVar12 = auStack_487 + lVar8 + -7;
    break;
  case 0xd1:
    puVar12 = auStack_487 + lVar8 + -6;
    uVar7 = (ulong)(short)(*(ushort *)(puVar39 + -1) << 8 | *(ushort *)(puVar39 + -1) >> 8);
    break;
  case 0xd2:
    uVar20 = *(uint *)(puVar39 + -1);
    puVar12 = auStack_487 + lVar8 + -4;
    uVar7 = (ulong)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                        uVar20 << 0x18);
    break;
  case 0xd3:
    uVar38 = *(ulong *)(puVar39 + -1);
    uVar7 = uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 | (uVar38 & 0xff0000000000) >> 0x18
            | (uVar38 & 0xff00000000) >> 8 | (uVar38 & 0xff000000) << 8 |
            (uVar38 & 0xff0000) << 0x18 | (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38;
LAB_00137f5c:
    puVar12 = auStack_487 + lVar8;
    break;
  default:
    if ((char)bVar10 < -0x20) goto LAB_00137e70;
    puVar12 = auStack_487 + lVar8 + -8;
  }
  iVar3 = 1;
LAB_00137faa:
  pcVar17 = "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
  pcStack_4c8 = (code *)0x137fd2;
  _ok(iVar3,"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",(ulong)(uint)(int)(char)bVar10);
  pcStack_4c8 = (code *)0x137ff8;
  _ok((uint)(puVar35 == puVar12),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  if ((int)uStack_4b4 < 0) {
    if (-1 < (long)uVar7) goto LAB_00138095;
    pcVar18 = "(int64_t)num1 == (int64_t)num2";
    iVar3 = 0x746;
  }
  else {
    if ((long)uVar7 < 0) {
LAB_00138090:
      pcStack_4c8 = (code *)0x138095;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_00138095:
      pcStack_4c8 = (code *)0x13809a;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_0013809a:
      pcStack_4c8 = (code *)0x13809f;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_0013809f:
      pcStack_4c8 = (code *)0x1380be;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    pcVar18 = "(uint64_t)num1 == (uint64_t)num2";
    iVar3 = 0x743;
  }
  pacVar15 = (char (*) [16])(ulong)(uVar7 == uStack_4b0);
  pcStack_4c8 = (code *)0x13805f;
  _ok((uint)(uVar7 == uStack_4b0),pcVar18,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar3,
      "check int number");
  lVar6 = lVar6 + 1;
  puVar39 = puVar39 + 0x10;
  uStack_4a0 = uStack_4a0 - 1;
  if (uStack_4a0 == 0) {
    return;
  }
  goto LAB_00137d70;
LAB_00138274:
  lVar8 = lVar6 * 0x10;
  pcVar30 = pcVar33 + -2;
  bVar10 = pcVar33[-2];
  pacVar14 = (char (*) [16])(ulong)bVar10;
  pacVar27 = (char (*) [16])(long)(char)bVar10;
  mVar1 = mp_type_hint[(long)pacVar14];
  if (mVar1 != MP_UINT) {
    if (mVar1 == MP_FLOAT) {
      if (bVar10 != 0xca) {
LAB_001385f4:
        pcStack_730 = (code *)0x138613;
        __assert_fail("c == 0xca",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x97e,"float mp_decode_float(const char **)");
      }
      uVar20 = *(uint *)(pcVar33 + -1);
      fVar16 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                      uVar20 << 0x18);
      if ((fVar16 == fStack_71c) && (!NAN(fVar16) && !NAN(fStack_71c))) {
        pcVar17 = pcVar33 + 3;
        goto LAB_0013837a;
      }
      pcStack_730 = (code *)0x138618;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_00138618:
      pcStack_730 = (code *)0x13861d;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      goto LAB_0013861d;
    }
    if (mVar1 == MP_INT) {
      switch(bVar10) {
      case 0xd0:
        pacVar14 = (char (*) [16])(long)pcVar33[-1];
        pcVar18 = (char *)&switchD_001382d0::switchdataD_00140dbc;
        pcVar17 = pcVar33;
        break;
      case 0xd1:
        pacVar14 = (char (*) [16])
                   (long)(short)(*(ushort *)(pcVar33 + -1) << 8 | *(ushort *)(pcVar33 + -1) >> 8);
        pcVar18 = (char *)&switchD_001382d0::switchdataD_00140dbc;
        pcVar17 = acStack_6ef + lVar8 + -6;
        break;
      case 0xd2:
        uVar20 = *(uint *)(pcVar33 + -1);
        pacVar14 = (char (*) [16])
                   (long)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                              uVar20 << 0x18);
        pcVar18 = (char *)&switchD_001382d0::switchdataD_00140dbc;
        pcVar17 = acStack_6ef + lVar8 + -4;
        break;
      case 0xd3:
        uVar38 = *(ulong *)(pcVar33 + -1);
        pacVar14 = (char (*) [16])
                   (uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                    (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                    (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                    (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38);
        pcVar18 = (char *)&switchD_001382d0::switchdataD_00140dbc;
        pcVar17 = acStack_6ef + lVar8;
        break;
      default:
        if (bVar10 < 0xe0) {
          pcStack_730 = (code *)0x1385c6;
          test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
          goto LAB_001385c6;
        }
        pacVar14 = pacVar27;
        pcVar17 = acStack_6ef + lVar8 + -8;
      }
      if (pacVar14 != pacStack_718) goto LAB_00138618;
      goto LAB_0013840f;
    }
    if (bVar10 != 0xcb) goto LAB_001385d0;
    uVar38 = *(ulong *)(pcVar33 + -1);
    dVar19 = (double)(uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                      (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                      (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                      (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38);
    if ((dVar19 != dStack_708) || (NAN(dVar19) || NAN(dStack_708))) {
      pcStack_730 = (code *)0x1385f4;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      goto LAB_001385f4;
    }
    pcVar17 = acStack_6ef + lVar8;
    goto LAB_0013837a;
  }
  switch(bVar10) {
  case 0xcc:
    pacVar14 = (char (*) [16])(ulong)(byte)pcVar33[-1];
    pcVar18 = (char *)&switchD_00138333::switchdataD_00140dac;
    pcVar17 = pcVar33;
    break;
  case 0xcd:
    pacVar14 = (char (*) [16])
               (ulong)(ushort)(*(ushort *)(pcVar33 + -1) << 8 | *(ushort *)(pcVar33 + -1) >> 8);
    pcVar18 = (char *)&switchD_00138333::switchdataD_00140dac;
    pcVar17 = acStack_6ef + lVar8 + -6;
    break;
  case 0xce:
    uVar20 = *(uint *)(pcVar33 + -1);
    pacVar14 = (char (*) [16])
               (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                      uVar20 << 0x18);
    pcVar18 = (char *)&switchD_00138333::switchdataD_00140dac;
    pcVar17 = acStack_6ef + lVar8 + -4;
    break;
  case 0xcf:
    uVar38 = *(ulong *)(pcVar33 + -1);
    pacVar14 = (char (*) [16])
               (uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 | (uVar38 & 0xff00) << 0x28
               | uVar38 << 0x38);
    pcVar18 = (char *)&switchD_00138333::switchdataD_00140dac;
    pcVar17 = acStack_6ef + lVar8;
    break;
  default:
    if (-1 < (char)bVar10) {
      pcVar17 = acStack_6ef + lVar8 + -8;
      break;
    }
LAB_001385c6:
    pcStack_730 = (code *)0x1385cb;
    test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
    goto LAB_001385cb;
  }
  if (pacVar14 != pacStack_718) {
LAB_0013861d:
    pcStack_730 = test_read_num<double,int,int(*)(char_const**,double*)>;
    test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
    iVar3 = (int)pacVar15;
    builtin_strncpy(acStack_860,"typed read of ",0xf);
    pcStack_990 = (code *)(long)iVar3;
    if (iVar3 < 0) {
      pcVar30 = "%lld";
      pcVar13 = pcStack_990;
    }
    else {
      pcVar30 = "%llu";
      pcVar13 = (code *)((ulong)pacVar15 & 0xffffffff);
    }
    pcStack_998 = (code *)0x1386a4;
    pacStack_968 = (char (*) [16])pcVar18;
    pacStack_758 = (char (*) [16])pcVar22;
    pcStack_750 = pcVar17;
    pcStack_748 = pcVar33;
    pacStack_740 = (char (*) [16])val;
    lStack_738 = lVar6;
    pcStack_730 = (code *)(&bStack_6f8 + lVar8);
    iVar4 = snprintf(acStack_860 + 0xe,0xf2,pcVar30,pcVar13);
    pcVar17 = acStack_860 + 0xe + iVar4;
    iVar5 = 0;
    pcStack_998 = (code *)0x1386c3;
    iVar4 = snprintf(pcVar17,(size_t)(auStack_760 + -(long)pcVar17)," into ");
    puVar39 = auStack_760 + -(long)(pcVar17 + iVar4);
    pcStack_998 = (code *)0x1386dd;
    snprintf(pcVar17 + iVar4,(size_t)puVar39,"double");
    pcStack_998 = (code *)0x1386ec;
    _space((FILE *)_stdout);
    pcStack_998 = (code *)0x138705;
    fwrite("# ",2,1,_stdout);
    pcStack_998 = (code *)0x138715;
    fputs(acStack_860,_stdout);
    pcStack_998 = (code *)0x138722;
    fputc(10,_stdout);
    if (-1 < iVar3) {
      pcStack_998 = (code *)0x138733;
      iVar5 = test_encode_uint_all_sizes
                        ((char (*) [16])&bStack_960,(uint64_t)((ulong)pacVar15 & 0xffffffff));
    }
    pcVar18 = (char *)(&bStack_960 + (long)iVar5 * 0x10);
    pcStack_998 = (code *)0x138751;
    pcVar17 = (char *)pcStack_990;
    iVar4 = test_encode_int_all_sizes((char (*) [16])pcVar18,(int64_t)pcStack_990);
    uVar20 = iVar5 + iVar4;
    if (uVar20 == 0 || SCARRY4(iVar5,iVar4) != (int)uVar20 < 0) {
      return;
    }
    fStack_984 = (float)iVar3;
    dStack_980 = (double)iVar3;
    uVar38 = (ulong)uVar20;
    puVar34 = (undefined8 *)(auStack_95f + 1);
    pcVar33 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    lVar6 = 0;
    goto LAB_00138782;
  }
LAB_0013840f:
  switch(bVar10) {
  case 0xcc:
    pacVar27 = (char (*) [16])(ulong)(byte)pcVar33[-1];
    goto LAB_0013843d;
  case 0xcd:
    pcVar25 = acStack_6ef + lVar8 + -6;
    pacVar27 = (char (*) [16])
               (ulong)(ushort)(*(ushort *)(pcVar33 + -1) << 8 | *(ushort *)(pcVar33 + -1) >> 8);
    break;
  case 0xce:
    uVar20 = *(uint *)(pcVar33 + -1);
    pacVar27 = (char (*) [16])
               (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                      uVar20 << 0x18);
    pcVar25 = acStack_6ef + lVar8 + -4;
    break;
  case 0xcf:
    uVar38 = *(ulong *)(pcVar33 + -1);
    pacVar27 = (char (*) [16])
               (uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 | (uVar38 & 0xff00) << 0x28
               | uVar38 << 0x38);
    if (-1 < (long)pacVar27) goto LAB_00138468;
LAB_0013837a:
    pacVar27 = (char (*) [16])0x0;
    iVar4 = 1;
    iVar3 = 0;
    pcVar25 = pcVar30;
    goto LAB_001384b7;
  case 0xd0:
    pacVar27 = (char (*) [16])(long)pcVar33[-1];
LAB_0013843d:
    pcVar25 = acStack_6ef + lVar8 + -7;
    break;
  case 0xd1:
    pcVar25 = acStack_6ef + lVar8 + -6;
    pacVar27 = (char (*) [16])
               (long)(short)(*(ushort *)(pcVar33 + -1) << 8 | *(ushort *)(pcVar33 + -1) >> 8);
    break;
  case 0xd2:
    uVar20 = *(uint *)(pcVar33 + -1);
    pcVar25 = acStack_6ef + lVar8 + -4;
    pacVar27 = (char (*) [16])
               (long)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                          uVar20 << 0x18);
    break;
  case 0xd3:
    uVar38 = *(ulong *)(pcVar33 + -1);
    pacVar27 = (char (*) [16])
               (uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 | (uVar38 & 0xff00) << 0x28
               | uVar38 << 0x38);
LAB_00138468:
    pcVar25 = acStack_6ef + lVar8;
    break;
  default:
    if ((char)bVar10 < -0x20) goto LAB_0013837a;
    pcVar25 = acStack_6ef + lVar8 + -8;
  }
  iVar3 = 1;
  iVar4 = 0;
LAB_001384b7:
  if ((char)iStack_70c == '\0') {
    pcVar36 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_730 = (code *)0x138579;
    _ok(iVar4,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar10);
    pacVar15 = (char (*) [16])(ulong)(pcVar30 == pcVar25);
    pcVar18 = "mp_num_pos2 == mp_nums[i]";
    pcStack_730 = (code *)0x13859f;
    _ok((uint)(pcVar30 == pcVar25),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
  }
  else {
    pcStack_730 = (code *)0x1384ef;
    _ok(iVar3,"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar10);
    pcVar30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_730 = (code *)0x13851c;
    _ok((uint)(pcVar17 == pcVar25),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    if ((long)pacVar27 < 0) {
LAB_001385cb:
      pcStack_730 = (code *)0x1385d0;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_001385d0:
      pcStack_730 = (code *)0x1385ef;
      __assert_fail("c == 0xcb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x987,"double mp_decode_double(const char **)");
    }
    pacVar15 = (char (*) [16])(ulong)(pacVar27 == pacStack_718);
    pcVar18 = "(uint64_t)num1 == (uint64_t)num2";
    pcStack_730 = (code *)0x13854d;
    _ok((uint)(pacVar27 == pacStack_718),"(uint64_t)num1 == (uint64_t)num2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x743,"check int number");
    pcVar36 = pcVar22;
  }
  lVar6 = lVar6 + 1;
  pcVar33 = pcVar33 + 0x10;
  pcVar22 = pcVar22 + -1;
  pcVar17 = pcVar30;
  val = (uint *)pcVar36;
  if (pcVar22 == (char *)0x0) {
    return;
  }
  goto LAB_00138274;
LAB_00138782:
  lVar8 = lVar6 * 0x10;
  bVar10 = *(byte *)((long)puVar34 + -2);
  pcVar13 = (code *)(ulong)bVar10;
  mVar1 = mp_type_hint[(long)pcVar13];
  puVar23 = puVar34;
  if (mVar1 == MP_UINT) {
    switch(bVar10) {
    case 0xcc:
      pcVar13 = (code *)(ulong)*(byte *)((long)puVar34 + -1);
      break;
    case 0xcd:
      pcVar13 = (code *)(ulong)(ushort)(*(ushort *)((long)puVar34 + -1) << 8 |
                                       *(ushort *)((long)puVar34 + -1) >> 8);
      puVar23 = (undefined8 *)((long)auStack_957 + lVar8 + -6);
      break;
    case 0xce:
      uVar20 = *(uint *)((long)puVar34 + -1);
      pcVar13 = (code *)(ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                               uVar20 << 0x18);
      puVar23 = (undefined8 *)((long)auStack_957 + lVar8 + -4);
      break;
    case 0xcf:
      uVar7 = *(ulong *)((long)puVar34 + -1);
      pcVar13 = (code *)(uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                         (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                         (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                         (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38);
      puVar23 = auStack_957 + lVar6 * 2;
      break;
    default:
      if ((char)bVar10 < '\0') {
LAB_001389dc:
        pcStack_998 = (code *)0x1389e1;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001389e1:
        pcStack_998 = (code *)0x1389e6;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001389e6:
        pcStack_998 = (code *)0x138a05;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      puVar23 = auStack_957 + lVar6 * 2 + -1;
    }
    if (pcVar13 != pcStack_990) {
      pcStack_998 = (code *)0x138a2e;
      test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_00138a2e:
      pcStack_998 = test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      pcStack_998 = (code *)0x1411a4;
      builtin_strncpy(acStack_ac8,"typed read of ",0xf);
      pcStack_c00 = (code *)0x138a9a;
      uStack_be4 = extraout_EDX;
      pcStack_bd0 = (code *)pcVar17;
      puStack_9c0 = puVar23;
      uStack_9b8 = uVar38;
      puStack_9b0 = puVar34;
      lStack_9a8 = lVar6;
      puStack_9a0 = puVar39;
      iVar3 = snprintf(acStack_ac8 + 0xe,0xf2,"%llu",pcVar18);
      pcVar17 = acStack_ac8 + (long)iVar3 + 0xe;
      pcStack_c00 = (code *)0x138abe;
      iVar3 = snprintf(pcVar17,(size_t)(auStack_9c8 + -(long)pcVar17)," into ");
      pcStack_c00 = (code *)0x138ad8;
      snprintf(pcVar17 + iVar3,(size_t)(auStack_9c8 + -(long)(pcVar17 + iVar3)),"double");
      pcStack_c00 = (code *)0x138ae7;
      _space((FILE *)_stdout);
      pcStack_c00 = (code *)0x138b00;
      fwrite("# ",2,1,_stdout);
      pcStack_c00 = (code *)0x138b10;
      fputs(acStack_ac8,_stdout);
      pcStack_c00 = (code *)0x138b1d;
      fputc(10,_stdout);
      pcStack_c00 = (code *)0x138b2a;
      iVar3 = test_encode_uint_all_sizes((char (*) [16])&bStack_bc8,(uint64_t)pcVar18);
      pacVar15 = (char (*) [16])(&bStack_bc8 + (long)iVar3 * 0x10);
      pcStack_c00 = (code *)0x138b48;
      pacStack_bf8 = (char (*) [16])pcVar18;
      iVar4 = test_encode_int_all_sizes(pacVar15,(int64_t)pcVar18);
      uVar20 = iVar3 + iVar4;
      if (uVar20 == 0 || SCARRY4(iVar3,iVar4) != (int)uVar20 < 0) {
        return;
      }
      fStack_be8 = (float)(long)pacStack_bf8;
      dStack_be0 = (double)(long)pacStack_bf8;
      uVar38 = (ulong)uVar20;
      pcVar22 = (char *)((long)&uStack_bc7 + 1);
      lVar6 = 0;
      goto LAB_00138b77;
    }
  }
  else if (mVar1 == MP_FLOAT) {
    if (bVar10 != 0xca) {
LAB_00138a0a:
      pcStack_998 = (code *)0x138a29;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar20 = *(uint *)((long)puVar34 + -1);
    fVar16 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                    uVar20 << 0x18);
    if ((fVar16 != fStack_984) || (NAN(fVar16) || NAN(fStack_984))) goto LAB_001389e1;
    puVar23 = (undefined8 *)((long)puVar34 + 3);
  }
  else if (mVar1 == MP_INT) {
    pcVar13 = (code *)(long)(char)bVar10;
    switch(bVar10) {
    case 0xd0:
      pcVar13 = (code *)(long)*(char *)((long)puVar34 + -1);
      pcVar17 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    case 0xd1:
      pcVar13 = (code *)(long)(short)(*(ushort *)((long)puVar34 + -1) << 8 |
                                     *(ushort *)((long)puVar34 + -1) >> 8);
      puVar23 = (undefined8 *)((long)auStack_957 + lVar8 + -6);
      pcVar17 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    case 0xd2:
      uVar20 = *(uint *)((long)puVar34 + -1);
      pcVar13 = (code *)(long)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 |
                                    (uVar20 & 0xff00) << 8 | uVar20 << 0x18);
      puVar23 = (undefined8 *)((long)auStack_957 + lVar8 + -4);
      pcVar17 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    case 0xd3:
      uVar7 = *(ulong *)((long)puVar34 + -1);
      pcVar13 = (code *)(uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                         (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                         (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                         (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38);
      puVar23 = auStack_957 + lVar6 * 2;
      pcVar17 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    default:
      if (bVar10 < 0xe0) {
        pcStack_998 = (code *)0x1389dc;
        test_read_num<double,int,int(*)(char_const**,double*)>();
        goto LAB_001389dc;
      }
      puVar23 = auStack_957 + lVar6 * 2 + -1;
    }
    if (pcVar13 != pcStack_990) goto LAB_00138a2e;
  }
  else {
    if (bVar10 != 0xcb) goto LAB_001389e6;
    uVar7 = *(ulong *)((long)puVar34 + -1);
    dVar19 = (double)(uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                      (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                      (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                      (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38);
    if ((dVar19 != dStack_980) || (NAN(dVar19) || NAN(dStack_980))) {
      pcStack_998 = (code *)0x138a0a;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      goto LAB_00138a0a;
    }
    puVar23 = auStack_957 + lVar6 * 2;
  }
  puStack_970 = (undefined8 *)((long)puVar34 + -2);
  puVar39 = (undefined1 *)(ulong)(uint)(int)(char)bVar10;
  dStack_978 = 0.0;
  pcStack_998 = (code *)0x138922;
  iVar3 = (*(code *)pacStack_968)(&puStack_970,&dStack_978);
  pcStack_998 = (code *)0x13894a;
  _ok((uint)(iVar3 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",puVar39);
  pcStack_998 = (code *)0x138972;
  _ok((uint)(puVar23 == puStack_970),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar40 = ABS(dStack_980 - dStack_978) < 1e-15;
  pcVar18 = (char *)(ulong)bVar40;
  pcVar17 = "double_eq(num1, num2)";
  pcStack_998 = (code *)0x1389b5;
  _ok((uint)bVar40,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  lVar6 = lVar6 + 1;
  puVar34 = puVar34 + 2;
  uVar38 = uVar38 - 1;
  if (uVar38 == 0) {
    return;
  }
  goto LAB_00138782;
LAB_00138b77:
  lVar8 = lVar6 * 0x10;
  bVar10 = pcVar22[-2];
  pacVar14 = (char (*) [16])(ulong)bVar10;
  mVar1 = mp_type_hint[(long)pacVar14];
  pcVar30 = pcVar22;
  if (mVar1 == MP_UINT) {
    switch(bVar10) {
    case 0xcc:
      pacVar14 = (char (*) [16])(ulong)(byte)pcVar22[-1];
      break;
    case 0xcd:
      pacVar14 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pcVar22 + -1) << 8 | *(ushort *)(pcVar22 + -1) >> 8);
      pcVar30 = acStack_bbf + lVar8 + -6;
      break;
    case 0xce:
      uVar20 = *(uint *)(pcVar22 + -1);
      pacVar14 = (char (*) [16])
                 (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                        uVar20 << 0x18);
      pcVar30 = acStack_bbf + lVar8 + -4;
      break;
    case 0xcf:
      uVar7 = *(ulong *)(pcVar22 + -1);
      pacVar14 = (char (*) [16])
                 (uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                  (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                  (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28
                 | uVar7 << 0x38);
      pcVar30 = acStack_bbf + lVar6 * 0x10;
      break;
    default:
      if ((char)bVar10 < '\0') {
LAB_00138e36:
        pcStack_c00 = (code *)0x138e3b;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e3b:
        pcStack_c00 = (code *)0x138e40;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e40:
        pcStack_c00 = (code *)0x138e5f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar30 = acStack_bbf + (lVar6 * 2 + -1) * 8;
    }
    if (pacVar14 != pacStack_bf8) {
      pcStack_c00 = (code *)0x138e88;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e88:
      pcStack_c00 = test_read_num<double,long_long,int(*)(char_const**,double*)>;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_e30,"typed read of ",0xf);
      pcStack_e68 = (code *)0x138ef1;
      uStack_e4c = extraout_EDX_00;
      pacStack_e38 = (char (*) [16])pcVar18;
      lStack_c28 = lVar6;
      uStack_c20 = uVar38;
      pcStack_c18 = pcVar17;
      pcStack_c10 = pcVar30;
      pcStack_c08 = pcVar22;
      pcStack_c00 = (code *)pcVar33;
      iVar3 = snprintf(acStack_e30 + 0xe,0xf2,"%lld",pacVar15);
      pcVar17 = acStack_e30 + (long)iVar3 + 0xe;
      pcStack_e68 = (code *)0x138f12;
      iVar3 = snprintf(pcVar17,(size_t)(&bStack_d30 + -(long)pcVar17)," into ");
      pcStack_e68 = (code *)0x138f2c;
      snprintf(pcVar17 + iVar3,(size_t)(&bStack_d30 + -(long)(pcVar17 + iVar3)),"double");
      pcStack_e68 = (code *)0x138f3b;
      _space((FILE *)_stdout);
      pcStack_e68 = (code *)0x138f54;
      fwrite("# ",2,1,_stdout);
      pcStack_e68 = (code *)0x138f61;
      fputs(acStack_e30,_stdout);
      pcStack_e68 = (code *)0x138f6e;
      fputc(10,_stdout);
      pacVar14 = (char (*) [16])&bStack_d30;
      pcStack_e68 = (code *)0x138f82;
      pacStack_e60 = pacVar15;
      uVar20 = test_encode_int_all_sizes(pacVar14,(int64_t)pacVar15);
      if ((int)uVar20 < 1) {
        return;
      }
      fStack_e50 = (float)(long)pacStack_e60;
      dStack_e48 = (double)(long)pacStack_e60;
      uVar38 = (ulong)uVar20;
      pcVar18 = (char *)((long)&uStack_d2f + 1);
      lVar6 = 0;
      goto LAB_00138fb4;
    }
  }
  else if (mVar1 == MP_FLOAT) {
    if (bVar10 != 0xca) {
LAB_00138e64:
      pcStack_c00 = (code *)0x138e83;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar20 = *(uint *)(pcVar22 + -1);
    fVar16 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                    uVar20 << 0x18);
    if ((fVar16 != fStack_be8) || (NAN(fVar16) || NAN(fStack_be8))) goto LAB_00138e3b;
    pcVar30 = pcVar22 + 3;
  }
  else if (mVar1 == MP_INT) {
    pacVar14 = (char (*) [16])(long)(char)bVar10;
    switch(bVar10) {
    case 0xd0:
      pacVar14 = (char (*) [16])(long)pcVar22[-1];
      pcVar18 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      break;
    case 0xd1:
      pacVar14 = (char (*) [16])
                 (long)(short)(*(ushort *)(pcVar22 + -1) << 8 | *(ushort *)(pcVar22 + -1) >> 8);
      pcVar18 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      pcVar30 = acStack_bbf + lVar8 + -6;
      break;
    case 0xd2:
      uVar20 = *(uint *)(pcVar22 + -1);
      pacVar14 = (char (*) [16])
                 (long)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                            uVar20 << 0x18);
      pcVar18 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      pcVar30 = acStack_bbf + lVar8 + -4;
      break;
    case 0xd3:
      uVar7 = *(ulong *)(pcVar22 + -1);
      pacVar14 = (char (*) [16])
                 (uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                  (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                  (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28
                 | uVar7 << 0x38);
      pcVar18 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      pcVar30 = acStack_bbf + lVar6 * 0x10;
      break;
    default:
      if (bVar10 < 0xe0) {
        pcStack_c00 = (code *)0x138e36;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
        goto LAB_00138e36;
      }
      pcVar30 = acStack_bbf + (lVar6 * 2 + -1) * 8;
    }
    if (pacVar14 != pacStack_bf8) goto LAB_00138e88;
  }
  else {
    if (bVar10 != 0xcb) goto LAB_00138e40;
    uVar7 = *(ulong *)(pcVar22 + -1);
    dVar19 = (double)(uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                      (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                      (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                      (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38);
    if ((dVar19 != dStack_be0) || (NAN(dVar19) || NAN(dStack_be0))) {
      pcStack_c00 = (code *)0x138e64;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      goto LAB_00138e64;
    }
    pcVar30 = acStack_bbf + lVar6 * 0x10;
  }
  pcVar33 = pcVar22 + -2;
  pcVar17 = (char *)(ulong)(uint)(int)(char)bVar10;
  dStack_bd8 = 0.0;
  pcStack_c00 = (code *)0x138d17;
  pcStack_bf0 = pcVar33;
  iVar3 = (*pcStack_bd0)(&pcStack_bf0,&dStack_bd8);
  if ((char)uStack_be4 == '\0') {
    pcStack_c00 = (code *)0x138de7;
    _ok((uint)(iVar3 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar17);
    bVar40 = pcVar33 == pcStack_bf0;
    pcVar18 = "mp_num_pos2 == mp_nums[i]";
    iVar3 = 0x738;
    pcVar30 = "check position";
  }
  else {
    pcVar33 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_c00 = (code *)0x138d51;
    _ok((uint)(iVar3 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar17);
    pcStack_c00 = (code *)0x138d79;
    _ok((uint)(pcVar30 == pcStack_bf0),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar40 = ABS(dStack_be0 - dStack_bd8) < 1e-15;
    pcVar18 = "double_eq(num1, num2)";
    iVar3 = 0x73e;
    pcVar30 = "check float number";
  }
  pacVar15 = (char (*) [16])(ulong)bVar40;
  pcStack_c00 = (code *)0x138e0f;
  _ok((uint)bVar40,pcVar18,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar3,
      pcVar30);
  lVar6 = lVar6 + 1;
  pcVar22 = pcVar22 + 0x10;
  uVar38 = uVar38 - 1;
  if (uVar38 == 0) {
    return;
  }
  goto LAB_00138b77;
LAB_00138fb4:
  lVar8 = lVar6 * 0x10;
  bVar10 = pcVar18[-2];
  pacVar15 = (char (*) [16])(ulong)bVar10;
  mVar1 = mp_type_hint[(long)pacVar15];
  pcVar22 = pcVar18;
  if (mVar1 == MP_UINT) {
    switch(bVar10) {
    case 0xcc:
      pacVar15 = (char (*) [16])(ulong)(byte)pcVar18[-1];
      break;
    case 0xcd:
      pacVar15 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pcVar18 + -1) << 8 | *(ushort *)(pcVar18 + -1) >> 8);
      pcVar22 = acStack_d27 + lVar8 + -6;
      break;
    case 0xce:
      uVar20 = *(uint *)(pcVar18 + -1);
      pacVar15 = (char (*) [16])
                 (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                        uVar20 << 0x18);
      pcVar22 = acStack_d27 + lVar8 + -4;
      break;
    case 0xcf:
      uVar7 = *(ulong *)(pcVar18 + -1);
      pacVar15 = (char (*) [16])
                 (uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                  (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                  (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28
                 | uVar7 << 0x38);
      pcVar22 = acStack_d27 + lVar6 * 0x10;
      break;
    default:
      if ((char)bVar10 < '\0') {
LAB_00139276:
        pcStack_e68 = (code *)0x13927b;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_0013927b:
        pcStack_e68 = (code *)0x139280;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00139280:
        pcStack_e68 = (code *)0x13929f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar22 = acStack_d27 + (lVar6 * 2 + -1) * 8;
    }
    if (pacVar15 != pacStack_e60) {
      pcStack_e68 = (code *)0x1392c8;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_001392c8:
      pcStack_e68 = test_read_num<double,float,int(*)(char_const**,double*)>;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_1098,"typed read of ",0xf);
      uVar31 = CONCAT71((int7)(uVar38 >> 8),1);
      pcStack_10b0 = (code *)0x13932e;
      lStack_e90 = lVar6;
      uStack_e88 = uVar38;
      pcStack_e80 = pcVar17;
      pcStack_e78 = pcVar22;
      pcStack_e70 = pcVar18;
      pcStack_e68 = (code *)pcVar33;
      iVar3 = snprintf(acStack_1098 + 0xe,0xf2,"%f",0x41590b2200000000);
      pcVar17 = acStack_1098 + (long)iVar3 + 0xe;
      pcStack_10b0 = (code *)0x13934f;
      iVar3 = snprintf(pcVar17,(size_t)(abStack_f98 + -(long)pcVar17)," into ");
      pcStack_10b0 = (code *)0x139369;
      snprintf(pcVar17 + iVar3,(size_t)(abStack_f98 + -(long)(pcVar17 + iVar3)),"double");
      puVar37 = &stdout;
      pcStack_10b0 = (code *)0x139378;
      _space((FILE *)_stdout);
      pcStack_10b0 = (code *)0x139391;
      fwrite("# ",2,1,_stdout);
      pcStack_10b0 = (code *)0x13939e;
      fputs(acStack_1098,_stdout);
      pcVar13 = (code *)0xa;
      pcStack_10b0 = (code *)0x1393ab;
      fputc(10,_stdout);
      abStack_f98[0] = 0xca;
      abStack_f98[1] = 0x4a;
      abStack_f98[2] = 200;
      abStack_f98[3] = 0x59;
      abStack_f98[4] = 0x10;
      abStack_f88[0] = 0xcb;
      abStack_f88[1] = 0x41;
      abStack_f88[2] = 0x59;
      abStack_f88[3] = 0xb;
      abStack_f88[4] = 0x22;
      abStack_f88[5] = 0;
      abStack_f88[6] = 0;
      abStack_f88[7] = 0;
      abStack_f88[8] = 0;
      pbVar9 = abStack_f98;
      goto LAB_001393db;
    }
  }
  else if (mVar1 == MP_FLOAT) {
    if (bVar10 != 0xca) {
LAB_001392a4:
      pcStack_e68 = (code *)0x1392c3;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar20 = *(uint *)(pcVar18 + -1);
    fVar16 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                    uVar20 << 0x18);
    if ((fVar16 != fStack_e50) || (NAN(fVar16) || NAN(fStack_e50))) goto LAB_0013927b;
    pcVar22 = pcVar18 + 3;
  }
  else if (mVar1 == MP_INT) {
    pacVar15 = (char (*) [16])(long)(char)bVar10;
    switch(bVar10) {
    case 0xd0:
      pacVar15 = (char (*) [16])(long)pcVar18[-1];
      break;
    case 0xd1:
      pacVar15 = (char (*) [16])
                 (long)(short)(*(ushort *)(pcVar18 + -1) << 8 | *(ushort *)(pcVar18 + -1) >> 8);
      pcVar22 = acStack_d27 + lVar8 + -6;
      break;
    case 0xd2:
      uVar20 = *(uint *)(pcVar18 + -1);
      pacVar15 = (char (*) [16])
                 (long)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                            uVar20 << 0x18);
      pcVar22 = acStack_d27 + lVar8 + -4;
      break;
    case 0xd3:
      uVar7 = *(ulong *)(pcVar18 + -1);
      pacVar15 = (char (*) [16])
                 (uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                  (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                  (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28
                 | uVar7 << 0x38);
      pcVar22 = acStack_d27 + lVar6 * 0x10;
      break;
    default:
      if (bVar10 < 0xe0) {
        pcStack_e68 = (code *)0x139276;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
        goto LAB_00139276;
      }
      pcVar22 = acStack_d27 + (lVar6 * 2 + -1) * 8;
    }
    if (pacVar15 != pacStack_e60) goto LAB_001392c8;
  }
  else {
    if (bVar10 != 0xcb) goto LAB_00139280;
    uVar7 = *(ulong *)(pcVar18 + -1);
    dVar19 = (double)(uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                      (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                      (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                      (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38);
    if ((dVar19 != dStack_e48) || (NAN(dVar19) || NAN(dStack_e48))) {
      pcStack_e68 = (code *)0x1392a4;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      goto LAB_001392a4;
    }
    pcVar22 = acStack_d27 + lVar6 * 0x10;
  }
  pcVar33 = pcVar18 + -2;
  pcVar17 = (char *)(ulong)(uint)(int)(char)bVar10;
  dStack_e40 = 0.0;
  pcStack_e68 = (code *)0x139157;
  pcStack_e58 = pcVar33;
  iVar3 = (*(code *)pacStack_e38)(&pcStack_e58,&dStack_e40);
  if ((char)uStack_e4c == '\0') {
    pcStack_e68 = (code *)0x139227;
    _ok((uint)(iVar3 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar17);
    bVar40 = pcVar33 == pcStack_e58;
    pcVar22 = "mp_num_pos2 == mp_nums[i]";
    iVar3 = 0x738;
    pcVar30 = "check position";
  }
  else {
    pcVar33 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_e68 = (code *)0x139191;
    _ok((uint)(iVar3 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar17);
    pcStack_e68 = (code *)0x1391b9;
    _ok((uint)(pcVar22 == pcStack_e58),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar40 = ABS(dStack_e48 - dStack_e40) < 1e-15;
    pcVar22 = "double_eq(num1, num2)";
    iVar3 = 0x73e;
    pcVar30 = "check float number";
  }
  pacVar14 = (char (*) [16])(ulong)bVar40;
  pcStack_e68 = (code *)0x13924f;
  _ok((uint)bVar40,pcVar22,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar3,
      pcVar30);
  lVar6 = lVar6 + 1;
  pcVar18 = pcVar18 + 0x10;
  uVar38 = uVar38 - 1;
  if (uVar38 == 0) {
    return;
  }
  goto LAB_00138fb4;
LAB_001393db:
  bVar10 = *pbVar9;
  uVar38 = (ulong)bVar10;
  mVar1 = mp_type_hint[uVar38];
  if (mVar1 == MP_UINT) {
    if (bVar10 == 0xce) {
      uVar20 = *(uint *)(pbVar9 + 1);
      uVar7 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                     uVar20 << 0x18);
      pbVar24 = pbVar9 + 5;
LAB_001394a6:
      if (uVar7 == 0x642c88) goto LAB_001394cd;
    }
    else {
      if (bVar10 == 0xcf) {
        uVar7 = *(ulong *)(pbVar9 + 1);
        uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28 |
                uVar7 << 0x38;
        pbVar24 = pbVar9 + 9;
        goto LAB_001394a6;
      }
      if ((1 < bVar10 - 0xcc) && ((char)bVar10 < '\0')) {
        pcStack_10b0 = (code *)0x139617;
        test_read_num<double,float,int(*)(char_const**,double*)>();
        goto LAB_00139617;
      }
    }
    pcStack_10b0 = (code *)0x1395b5;
    test_read_num<double,float,int(*)(char_const**,double*)>();
    bVar10 = (byte)uVar38;
    uVar20 = extraout_EDX_01;
LAB_001395b5:
    if ((1 < uVar20 - 0xd0) && (bVar10 < 0xe0)) {
LAB_00139617:
      pcStack_10b0 = test_read_num<double,double,int(*)(char_const**,double*)>;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_12d0,"typed read of ",0xf);
      pacStack_10c8 = pacVar14;
      uStack_10c0 = uVar31;
      puStack_10b8 = puVar37;
      pcStack_10b0 = (code *)abStack_f88;
      iVar3 = snprintf(acStack_12d0 + 0xe,0xf2,"%lf",0xc0163851eb851eb8);
      pcVar17 = acStack_12d0 + (long)iVar3 + 0xe;
      iVar3 = snprintf(pcVar17,(size_t)(&uStack_11d0 + -(long)pcVar17)," into ");
      snprintf(pcVar17 + iVar3,(size_t)(&uStack_11d0 + -(long)(pcVar17 + iVar3)),"double");
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fputs(acStack_12d0,_stdout);
      fputc(10,_stdout);
      puStack_12d8 = &uStack_11d0;
      uStack_11d0 = 0xcb;
      uStack_11cf = 0xb81e85eb513816c0;
      dStack_12e0 = 0.0;
      iVar3 = (*pcVar13)(&puStack_12d8,&dStack_12e0);
      _ok((uint)(iVar3 == 0),"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",0xffffffcb);
      _ok((uint)(auStack_11c7 == puStack_12d8),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      _ok((uint)(ABS(-5.555 - dStack_12e0) < 1e-15),"double_eq(num1, num2)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73e,"check float number");
      return;
    }
LAB_001395c5:
    pcStack_10b0 = (code *)0x1395ca;
    test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_001395ca:
    pcStack_10b0 = (code *)0x1395cf;
    test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_001395cf:
    pcStack_10b0 = (code *)0x1395ee;
    __assert_fail("c == 0xcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                  ,0x987,"double mp_decode_double(const char **)");
  }
  if (mVar1 == MP_FLOAT) {
    if (bVar10 != 0xca) {
LAB_001395f3:
      pcStack_10b0 = (code *)0x139612;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar20 = *(uint *)(pbVar9 + 1);
    fVar16 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                    uVar20 << 0x18);
    if ((fVar16 == 6.565e+06) && (!NAN(fVar16))) {
      pbVar24 = pbVar9 + 5;
      goto LAB_001394cd;
    }
    goto LAB_001395ca;
  }
  if (mVar1 == MP_INT) {
    if (bVar10 != 0xd2) {
      uVar20 = (uint)bVar10;
      if (bVar10 == 0xd3) {
        uVar38 = *(ulong *)(pbVar9 + 1);
        uVar38 = uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                 (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                 (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                 (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38;
        pbVar24 = pbVar9 + 9;
        goto LAB_001394c0;
      }
      goto LAB_001395b5;
    }
    uVar20 = *(uint *)(pbVar9 + 1);
    pbVar24 = pbVar9 + 5;
    uVar38 = (ulong)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                         uVar20 << 0x18);
LAB_001394c0:
    if (uVar38 == 0x642c88) goto LAB_001394cd;
    goto LAB_001395c5;
  }
  if (bVar10 != 0xcb) goto LAB_001395cf;
  uVar38 = *(ulong *)(pbVar9 + 1);
  dVar19 = (double)(uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                    (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                    (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                    (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38);
  if ((dVar19 != 6565000.0) || (NAN(dVar19))) {
    pcStack_10b0 = (code *)0x1395f3;
    test_read_num<double,float,int(*)(char_const**,double*)>();
    goto LAB_001395f3;
  }
  pbVar24 = pbVar9 + 9;
LAB_001394cd:
  puVar37 = (undefined *)(ulong)(uint)(int)(char)bVar10;
  dStack_10a8 = 0.0;
  pcStack_10b0 = (code *)0x1394e8;
  pbStack_10a0 = pbVar9;
  iVar3 = (*(code *)pacVar14)(&pbStack_10a0,&dStack_10a8);
  pcStack_10b0 = (code *)0x139510;
  _ok((uint)(iVar3 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",puVar37);
  pcStack_10b0 = (code *)0x139538;
  _ok((uint)(pbVar24 == pbStack_10a0),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar40 = ABS(6565000.0 - dStack_10a8) < 1e-15;
  pcVar13 = (code *)(ulong)bVar40;
  pcStack_10b0 = (code *)0x13957c;
  _ok((uint)bVar40,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  cVar28 = (char)uVar31;
  uVar31 = 0;
  pbVar9 = abStack_f88;
  if (cVar28 == '\0') {
    return;
  }
  goto LAB_001393db;
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}